

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-brdf.cpp
# Opt level: O2

void mouseMotionCallback(GLFWwindow *window,double x,double y)

{
  double dVar1;
  double dVar2;
  int iVar3;
  ImGuiIO *pIVar4;
  float_t fVar5;
  float fVar6;
  vec3 vVar7;
  mat3 local_98;
  vec3 local_70;
  mat3 axis;
  mat3 local_3c;
  
  dVar1 = x - mouseMotionCallback::x0;
  dVar2 = y - mouseMotionCallback::y0;
  pIVar4 = ImGui::GetIO();
  if (pIVar4->WantCaptureMouse == false) {
    iVar3 = glfwGetMouseButton(window,0);
    if (iVar3 == 1) {
      dja::transpose(&g_camera.axis);
      local_70.x = 0.0;
      local_70.y = 0.0;
      local_70.z = 1.0;
      dja::mat3::rotation(&local_3c,&local_70,(float)(dVar1 * 0.005));
      dja::operator*(&local_98,&local_3c,&g_camera.axis);
      g_camera.axis.m[2].z = local_98.m[2].z;
      g_camera.axis.m[1].y = local_98.m[1].y;
      g_camera.axis.m[1].z = local_98.m[1].z;
      g_camera.axis.m[2].x = local_98.m[2].x;
      g_camera.axis.m[2].y = local_98.m[2].y;
      g_camera.axis.m[0].x = local_98.m[0].x;
      g_camera.axis.m[0].y = local_98.m[0].y;
      g_camera.axis.m[0].z = local_98.m[0].z;
      g_camera.axis.m[1].x = local_98.m[1].x;
      dja::mat3::rotation(&local_3c,axis.m + 1,(float)(dVar2 * 0.005));
      dja::operator*(&local_98,&local_3c,&g_camera.axis);
      g_camera.axis.m[2].z = local_98.m[2].z;
      g_camera.axis.m[1].y = local_98.m[1].y;
      g_camera.axis.m[1].z = local_98.m[1].z;
      g_camera.axis.m[2].x = local_98.m[2].x;
      g_camera.axis.m[2].y = local_98.m[2].y;
      g_camera.axis.m[0].x = local_98.m[0].x;
      g_camera.axis.m[0].y = local_98.m[0].y;
      g_camera.axis.m[0].z = local_98.m[0].z;
      g_camera.axis.m[1].x = local_98.m[1].x;
      vVar7 = dja::normalize(g_camera.axis.m);
      g_camera.axis.m[0].z = vVar7.z;
      g_camera.axis.m[0]._0_8_ = vVar7._0_8_;
      vVar7 = dja::normalize(g_camera.axis.m + 1);
      g_camera.axis.m[1].z = vVar7.z;
      g_camera.axis.m[1].x = vVar7.x;
      g_camera.axis.m[1].y = vVar7.y;
      vVar7 = dja::normalize(g_camera.axis.m + 2);
      g_camera.axis.m[2].z = vVar7.z;
      g_camera.axis.m[2]._0_8_ = vVar7._0_8_;
    }
    else {
      iVar3 = glfwGetMouseButton(window,1);
      if (iVar3 != 1) {
        mouseMotionCallback::x0 = x;
        mouseMotionCallback::y0 = y;
        return;
      }
      dja::transpose(&g_camera.axis);
      fVar6 = (float)dVar1;
      fVar5 = dja::norm(&g_camera.pos);
      local_98.m[0].z = axis.m[1].z * fVar6 * 0.005 * fVar5;
      local_98.m[0].y = fVar5 * fVar6 * axis.m[1].y * 0.005;
      local_98.m[0].x = fVar5 * fVar6 * axis.m[1].x * 0.005;
      dja::operator-=(&g_camera.pos,local_98.m);
      fVar6 = (float)dVar2;
      fVar5 = dja::norm(&g_camera.pos);
      local_98.m[0].z = axis.m[2].z * fVar6 * 0.005 * fVar5;
      local_98.m[0].y = fVar5 * fVar6 * axis.m[2].y * 0.005;
      local_98.m[0].x = fVar5 * fVar6 * axis.m[2].x * 0.005;
      dja::operator+=(&g_camera.pos,local_98.m);
    }
    g_framebuffer.flags.reset = true;
    mouseMotionCallback::x0 = x;
    mouseMotionCallback::y0 = y;
  }
  return;
}

Assistant:

void mouseMotionCallback(GLFWwindow* window, double x, double y)
{
    static double x0 = 0, y0 = 0;
    double dx = x - x0,
           dy = y - y0;

    ImGuiIO& io = ImGui::GetIO();
    if (io.WantCaptureMouse)
        return;

    if (glfwGetMouseButton(window, GLFW_MOUSE_BUTTON_LEFT) == GLFW_PRESS) {
        dja::mat3 axis = dja::transpose(g_camera.axis);
        g_camera.axis = dja::mat3::rotation(dja::vec3(0, 0, 1), dx * 5e-3)
                      * g_camera.axis;
        g_camera.axis = dja::mat3::rotation(axis[1], dy * 5e-3)
                      * g_camera.axis;
        g_camera.axis[0] = dja::normalize(g_camera.axis[0]);
        g_camera.axis[1] = dja::normalize(g_camera.axis[1]);
        g_camera.axis[2] = dja::normalize(g_camera.axis[2]);
        g_framebuffer.flags.reset = true;
    } else if (glfwGetMouseButton(window, GLFW_MOUSE_BUTTON_RIGHT) == GLFW_PRESS) {
        dja::mat3 axis = dja::transpose(g_camera.axis);
        g_camera.pos-= axis[1] * dx * 5e-3 * norm(g_camera.pos);
        g_camera.pos+= axis[2] * dy * 5e-3 * norm(g_camera.pos);
        g_framebuffer.flags.reset = true;
    }

    x0 = x;
    y0 = y;
}